

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O0

void __thiscall leveldb::EnvTest_ReadWrite_Test::TestBody(EnvTest_ReadWrite_Test *this)

{
  Env *pEVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar2;
  bool bVar3;
  uint32_t s;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  undefined8 uVar11;
  AssertHelper local_330;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_10;
  Message local_308;
  size_t local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_9;
  Message local_2e0;
  int local_2d4;
  size_t local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_8;
  Message local_2b0;
  Status local_2a8;
  char local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_7;
  Slice read;
  uint32_t local_270;
  int local_26c;
  string local_268 [4];
  int len_1;
  string scratch;
  string read_result;
  Message local_220;
  Status local_218;
  char local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_6;
  SequentialFile *sequential_file;
  Message local_1e8;
  Status local_1e0;
  char local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8;
  Status local_1b0;
  char local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_4;
  Message local_188;
  Status local_180;
  char local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  Message local_158;
  Slice local_150;
  Status local_140;
  char local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_110 [8];
  string r;
  undefined1 local_e8 [4];
  int len;
  string data;
  Message local_c0;
  Status local_b8;
  char local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  WritableFile *writable_file;
  string test_file_name;
  AssertHelper local_68;
  Message local_60;
  Status local_58;
  char local_49;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  string test_dir;
  Random rnd;
  EnvTest_ReadWrite_Test *this_local;
  
  s = test::RandomSeed();
  Random::Random((Random *)((long)&test_dir.field_2 + 0xc),s);
  std::__cxx11::string::string((string *)&gtest_ar.message_);
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[0x13])(&local_58,pEVar1,&gtest_ar.message_);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_48,&local_49,
             (Status *)"env_->GetTestDirectory(&test_dir)");
  Status::~Status(&local_58);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar3) {
    testing::Message::Message(&local_60);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
               ,0x1f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(&local_60);
  }
  test_file_name.field_2._13_3_ = 0;
  test_file_name.field_2._M_local_buf[0xc] = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (test_file_name.field_2._12_4_ != 0) goto LAB_0010d00a;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&writable_file
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &gtest_ar.message_,"/open_on_read.txt");
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[4])(&local_b8,pEVar1,&writable_file,&gtest_ar_1.message_);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_a8,&local_a9,
             (Status *)"env_->NewWritableFile(test_file_name, &writable_file)");
  Status::~Status(&local_b8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar3) {
    testing::Message::Message(&local_c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&data.field_2 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
               ,0x22,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&data.field_2 + 8),&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&data.field_2 + 8));
    testing::Message::~Message(&local_c0);
  }
  test_file_name.field_2._13_3_ = 0;
  test_file_name.field_2._M_local_buf[0xc] = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  if (test_file_name.field_2._12_4_ == 0) {
    std::__cxx11::string::string((string *)local_e8);
    do {
      uVar7 = std::__cxx11::string::size();
      if (0x9fffff < uVar7) {
        test::IsOK();
        testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
        (**(code **)(*(long *)gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 0x28))(&local_1b0);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_1a0,&local_1a1
                   ,(Status *)"writable_file->Sync()");
        Status::~Status(&local_1b0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
        if (!bVar3) {
          testing::Message::Message(&local_1b8);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                     ,0x31,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_1b8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_1b8);
        }
        test_file_name.field_2._13_3_ = 0;
        test_file_name.field_2._M_local_buf[0xc] = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
        if (test_file_name.field_2._12_4_ == 0) {
          test::IsOK();
          testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
          (**(code **)(*(long *)gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 0x18))(&local_1e0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_1d0,
                     &local_1d1,(Status *)"writable_file->Close()");
          Status::~Status(&local_1e0);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
          if (!bVar3) {
            testing::Message::Message(&local_1e8);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&sequential_file,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                       ,0x32,pcVar6);
            testing::internal::AssertHelper::operator=((AssertHelper *)&sequential_file,&local_1e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sequential_file);
            testing::Message::~Message(&local_1e8);
          }
          test_file_name.field_2._13_3_ = 0;
          test_file_name.field_2._M_local_buf[0xc] = !bVar3;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
          if (test_file_name.field_2._12_4_ == 0) {
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(long *)gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 8))();
            }
            test::IsOK();
            testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
            pEVar1 = (this->super_EnvTest).env_;
            (*pEVar1->_vptr_Env[2])(&local_218,pEVar1,&writable_file,&gtest_ar_6.message_);
            testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                      ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_208,
                       &local_209,
                       (Status *)"env_->NewSequentialFile(test_file_name, &sequential_file)");
            Status::~Status(&local_218);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
            if (!bVar3) {
              testing::Message::Message(&local_220);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)((long)&read_result.field_2 + 8),kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                         ,0x37,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)((long)&read_result.field_2 + 8),&local_220);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)((long)&read_result.field_2 + 8));
              testing::Message::~Message(&local_220);
            }
            test_file_name.field_2._13_3_ = 0;
            test_file_name.field_2._M_local_buf[0xc] = !bVar3;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
            if (test_file_name.field_2._12_4_ == 0) {
              std::__cxx11::string::string((string *)(scratch.field_2._M_local_buf + 8));
              std::__cxx11::string::string(local_268);
              goto LAB_0010caf2;
            }
          }
        }
        break;
      }
      r.field_2._12_4_ = Random::Skewed((Random *)((long)&test_dir.field_2 + 0xc),0x12);
      std::__cxx11::string::string((string *)local_110);
      join_0x00000010_0x00000000_ =
           test::RandomString((Random *)((long)&test_dir.field_2 + 0xc),r.field_2._12_4_,
                              (string *)local_110);
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      uVar2 = gtest_ar_1.message_;
      Slice::Slice(&local_150,(string *)local_110);
      (**(code **)(*(long *)uVar2._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 0x10))
                (&local_140,
                 uVar2._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,&local_150);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_130,&local_131,
                 (Status *)"writable_file->Append(r)");
      Status::~Status(&local_140);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
      if (!bVar3) {
        testing::Message::Message(&local_158);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                   ,0x2b,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_158);
      }
      test_file_name.field_2._13_3_ = 0;
      test_file_name.field_2._M_local_buf[0xc] = !bVar3;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
      if (test_file_name.field_2._12_4_ == 0) {
        std::__cxx11::string::operator+=((string *)local_e8,(string *)local_110);
        bVar3 = Random::OneIn((Random *)((long)&test_dir.field_2 + 0xc),10);
        if (bVar3) {
          test::IsOK();
          testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
          (**(code **)(*(long *)gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 0x20))(&local_180);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_170,
                     &local_171,(Status *)"writable_file->Flush()");
          Status::~Status(&local_180);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
          if (!bVar3) {
            testing::Message::Message(&local_188);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                       ,0x2e,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_188);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_188);
          }
          test_file_name.field_2._13_3_ = 0;
          test_file_name.field_2._M_local_buf[0xc] = !bVar3;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
          if (test_file_name.field_2._12_4_ != 0) goto LAB_0010c7c8;
        }
        test_file_name.field_2._12_4_ = 0;
      }
LAB_0010c7c8:
      std::__cxx11::string::~string((string *)local_110);
    } while (test_file_name.field_2._12_4_ == 0);
    goto LAB_0010cff2;
  }
  goto LAB_0010cffe;
LAB_0010caf2:
  uVar7 = std::__cxx11::string::size();
  uVar8 = std::__cxx11::string::size();
  if (uVar8 <= uVar7) goto LAB_0010ceee;
  local_270 = Random::Skewed((Random *)((long)&test_dir.field_2 + 0xc),0x12);
  iVar4 = std::__cxx11::string::size();
  iVar5 = std::__cxx11::string::size();
  read.size_._4_4_ = iVar4 - iVar5;
  piVar9 = std::min<int>((int *)&local_270,(int *)((long)&read.size_ + 4));
  local_26c = *piVar9;
  read.size_._0_4_ = 1;
  std::max<int>(&local_26c,(int *)&read.size_);
  std::__cxx11::string::resize((ulong)local_268);
  Slice::Slice((Slice *)&gtest_ar_7.message_);
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  uVar2 = gtest_ar_6.message_;
  lVar10 = (long)local_26c;
  uVar11 = std::__cxx11::string::operator[]((ulong)local_268);
  (**(code **)(*(long *)uVar2._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x10))
            (&local_2a8,
             uVar2._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,lVar10,&gtest_ar_7.message_,uVar11);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_298,&local_299,
             (Status *)"sequential_file->Read(len, &read, &scratch[0])");
  Status::~Status(&local_2a8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar3) {
    testing::Message::Message(&local_2b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
               ,0x3e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_2b0);
  }
  test_file_name.field_2._13_3_ = 0;
  test_file_name.field_2._M_local_buf[0xc] = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  if (test_file_name.field_2._12_4_ != 0) goto LAB_0010cfda;
  if (0 < local_26c) {
    local_2d0 = Slice::size((Slice *)&gtest_ar_7.message_);
    local_2d4 = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)local_2c8,"read.size()","0",&local_2d0,&local_2d4);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
    if (!bVar3) {
      testing::Message::Message(&local_2e0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
                 ,0x40,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_2e0);
    }
    test_file_name.field_2._13_3_ = 0;
    test_file_name.field_2._M_local_buf[0xc] = !bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
    if (test_file_name.field_2._12_4_ != 0) goto LAB_0010cfda;
  }
  local_300 = Slice::size((Slice *)&gtest_ar_7.message_);
  testing::internal::CmpHelperLE<unsigned_long,int>
            ((internal *)local_2f8,"read.size()","len",&local_300,&local_26c);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar3) {
    testing::Message::Message(&local_308);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
               ,0x42,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_308);
  }
  test_file_name.field_2._13_3_ = 0;
  test_file_name.field_2._M_local_buf[0xc] = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  if (test_file_name.field_2._12_4_ != 0) goto LAB_0010cfda;
  pcVar6 = Slice::data((Slice *)&gtest_ar_7.message_);
  Slice::size((Slice *)&gtest_ar_7.message_);
  std::__cxx11::string::append(scratch.field_2._M_local_buf + 8,(ulong)pcVar6);
  goto LAB_0010caf2;
LAB_0010ceee:
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_320,"read_result","data",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&scratch.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar3) {
    testing::Message::Message(&local_328);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_test.cc"
               ,0x45,pcVar6);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message(&local_328);
  }
  test_file_name.field_2._13_3_ = 0;
  test_file_name.field_2._M_local_buf[0xc] = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  if (test_file_name.field_2._12_4_ == 0) {
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar_6.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    test_file_name.field_2._12_4_ = 0;
  }
LAB_0010cfda:
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string((string *)(scratch.field_2._M_local_buf + 8));
LAB_0010cff2:
  std::__cxx11::string::~string((string *)local_e8);
LAB_0010cffe:
  std::__cxx11::string::~string((string *)&writable_file);
LAB_0010d00a:
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(EnvTest, ReadWrite) {
  Random rnd(test::RandomSeed());

  // Get file to use for testing.
  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  std::string test_file_name = test_dir + "/open_on_read.txt";
  WritableFile* writable_file;
  ASSERT_LEVELDB_OK(env_->NewWritableFile(test_file_name, &writable_file));

  // Fill a file with data generated via a sequence of randomly sized writes.
  static const size_t kDataSize = 10 * 1048576;
  std::string data;
  while (data.size() < kDataSize) {
    int len = rnd.Skewed(18);  // Up to 2^18 - 1, but typically much smaller
    std::string r;
    test::RandomString(&rnd, len, &r);
    ASSERT_LEVELDB_OK(writable_file->Append(r));
    data += r;
    if (rnd.OneIn(10)) {
      ASSERT_LEVELDB_OK(writable_file->Flush());
    }
  }
  ASSERT_LEVELDB_OK(writable_file->Sync());
  ASSERT_LEVELDB_OK(writable_file->Close());
  delete writable_file;

  // Read all data using a sequence of randomly sized reads.
  SequentialFile* sequential_file;
  ASSERT_LEVELDB_OK(env_->NewSequentialFile(test_file_name, &sequential_file));
  std::string read_result;
  std::string scratch;
  while (read_result.size() < data.size()) {
    int len = std::min<int>(rnd.Skewed(18), data.size() - read_result.size());
    scratch.resize(std::max(len, 1));  // at least 1 so &scratch[0] is legal
    Slice read;
    ASSERT_LEVELDB_OK(sequential_file->Read(len, &read, &scratch[0]));
    if (len > 0) {
      ASSERT_GT(read.size(), 0);
    }
    ASSERT_LE(read.size(), len);
    read_result.append(read.data(), read.size());
  }
  ASSERT_EQ(read_result, data);
  delete sequential_file;
}